

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O3

void * pem_read_RSAPublicKey_d2i(void **x,uchar **inp,long len)

{
  RSA *pRVar1;
  CBS CStack_28;
  
  if (len < 0) {
    pRVar1 = (RSA *)0x0;
  }
  else {
    CStack_28.data = *inp;
    CStack_28.len = len;
    pRVar1 = RSA_parse_public_key(&CStack_28);
    if (pRVar1 != (RSA *)0x0) {
      if (x != (void **)0x0) {
        RSA_free((RSA *)*x);
        *x = pRVar1;
      }
      *inp = CStack_28.data;
    }
  }
  return pRVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}